

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

wostream * mjs::operator<<(wostream *os,token *t)

{
  bool bVar1;
  token_type tVar2;
  wostream *pwVar3;
  wstring *this;
  undefined1 local_48 [16];
  wstring local_38;
  token *local_18;
  token *t_local;
  wostream *os_local;
  
  local_18 = t;
  t_local = (token *)os;
  pwVar3 = std::operator<<(os,"token{");
  tVar2 = token::type(local_18);
  operator<<(pwVar3,tVar2);
  tVar2 = token::type(local_18);
  if (tVar2 == numeric_literal) {
    pwVar3 = std::operator<<((wostream *)t_local,", ");
    std::wostream::operator<<(pwVar3,(local_18->field_1).dvalue_);
  }
  else {
    bVar1 = token::has_text(local_18);
    if (bVar1) {
      pwVar3 = std::operator<<((wostream *)t_local,", \"");
      this = token::text_abi_cxx11_(local_18);
      local_48 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)this);
      cpp_quote_abi_cxx11_(&local_38,(mjs *)local_48,local_48._8_8_);
      pwVar3 = std::operator<<(pwVar3,(wstring *)&local_38);
      std::operator<<(pwVar3,"\"");
      std::__cxx11::wstring::~wstring((wstring *)&local_38);
    }
  }
  pwVar3 = std::operator<<((wostream *)t_local,"}");
  return pwVar3;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const token& t) {
    os << "token{" << t.type();
    if (t.type() == token_type::numeric_literal) {
        os << ", " << t.dvalue_;
    } else if (t.has_text()) {
        os << ", \"" << cpp_quote(t.text()) << "\"";
    }
    return os << "}";
}